

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O3

coda_dynamic_type * coda_mem_empty_record(coda_format format)

{
  coda_type_record *definition;
  coda_mem_record *pcVar1;
  long in_FS_OFFSET;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assert_fail("format < num_empty_record_singletons",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                  ,0x31,"coda_dynamic_type *coda_mem_empty_record(coda_format)");
  }
  pcVar1 = *(coda_mem_record **)(in_FS_OFFSET + (ulong)format * 8 + -0xc0);
  if (pcVar1 == (coda_mem_record *)0x0) {
    definition = coda_type_empty_record(format);
    pcVar1 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    *(coda_mem_record **)(in_FS_OFFSET + (ulong)format * 8 + -0xc0) = pcVar1;
    if (pcVar1 == (coda_mem_record *)0x0) {
      __assert_fail("empty_record_singleton[format] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                    ,0x35,"coda_dynamic_type *coda_mem_empty_record(coda_format)");
    }
  }
  return (coda_dynamic_type *)pcVar1;
}

Assistant:

coda_dynamic_type *coda_mem_empty_record(coda_format format)
{
    assert(format < num_empty_record_singletons);
    if (empty_record_singleton[format] == NULL)
    {
        empty_record_singleton[format] = coda_mem_record_new(coda_type_empty_record(format), NULL);
        assert(empty_record_singleton[format] != NULL);
    }

    return (coda_dynamic_type *)empty_record_singleton[format];
}